

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CX.hpp
# Opt level: O1

void __thiscall
qclab::qgates::SWAP<float>::apply
          (SWAP<float> *this,Side side,Op op,int nbQubits,SquareMatrix<float> *matrix,int offset)

{
  char *__assertion;
  int target;
  int control;
  CNOT<float> cnot10;
  CNOT<float> cnot01;
  CX<float> local_60;
  CX<float> local_48;
  
  if (nbQubits < 2) {
    __assert_fail("nbQubits >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/SWAP.cpp"
                  ,0x24,
                  "virtual void qclab::qgates::SWAP<float>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = float]"
                 );
  }
  if (matrix->size_ == (long)(1 << ((byte)nbQubits & 0x1f))) {
    control = (this->qubits_)._M_elems[0] + offset;
    if (control < nbQubits) {
      target = offset + (this->qubits_)._M_elems[1];
      if (target < nbQubits) {
        CX<float>::CX(&local_48,control,target,1);
        CX<float>::CX(&local_60,target,control,1);
        CX<float>::apply(&local_48,side,op,nbQubits,matrix,0);
        CX<float>::apply(&local_60,side,op,nbQubits,matrix,0);
        CX<float>::apply(&local_48,side,op,nbQubits,matrix,0);
        local_60.super_QControlledGate2<float>.super_QGate2<float>.super_QObject<float>.
        _vptr_QObject = (QObject<float>)&PTR_nbQubits_005248f8;
        if (local_60.gate_._M_t.
            super___uniq_ptr_impl<qclab::qgates::PauliX<float>,_std::default_delete<qclab::qgates::PauliX<float>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_qclab::qgates::PauliX<float>_*,_std::default_delete<qclab::qgates::PauliX<float>_>_>
            .super__Head_base<0UL,_qclab::qgates::PauliX<float>_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<qclab::qgates::PauliX<float>,_std::default_delete<qclab::qgates::PauliX<float>_>_>
             )0x0) {
          (*(((QGate1<float> *)
             local_60.gate_._M_t.
             super___uniq_ptr_impl<qclab::qgates::PauliX<float>,_std::default_delete<qclab::qgates::PauliX<float>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_qclab::qgates::PauliX<float>_*,_std::default_delete<qclab::qgates::PauliX<float>_>_>
             .super__Head_base<0UL,_qclab::qgates::PauliX<float>_*,_false>._M_head_impl)->
            super_QObject<float>)._vptr_QObject[0xd])();
        }
        local_48.super_QControlledGate2<float>.super_QGate2<float>.super_QObject<float>.
        _vptr_QObject = (QObject<float>)&PTR_nbQubits_005248f8;
        if ((tuple<qclab::qgates::PauliX<float>_*,_std::default_delete<qclab::qgates::PauliX<float>_>_>
             )local_48.gate_._M_t.
              super___uniq_ptr_impl<qclab::qgates::PauliX<float>,_std::default_delete<qclab::qgates::PauliX<float>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_qclab::qgates::PauliX<float>_*,_std::default_delete<qclab::qgates::PauliX<float>_>_>
              .super__Head_base<0UL,_qclab::qgates::PauliX<float>_*,_false>._M_head_impl !=
            (_Head_base<0UL,_qclab::qgates::PauliX<float>_*,_false>)0x0) {
          (**(code **)(*(long *)local_48.gate_._M_t.
                                super___uniq_ptr_impl<qclab::qgates::PauliX<float>,_std::default_delete<qclab::qgates::PauliX<float>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_qclab::qgates::PauliX<float>_*,_std::default_delete<qclab::qgates::PauliX<float>_>_>
                                .super__Head_base<0UL,_qclab::qgates::PauliX<float>_*,_false>.
                                _M_head_impl + 0x68))();
        }
        return;
      }
      __assertion = "qubit1 < nbQubits";
    }
    else {
      __assertion = "qubit0 < nbQubits";
    }
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/SWAP.cpp"
                  ,0x28,
                  "virtual void qclab::qgates::SWAP<float>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = float]"
                 );
  }
  __assert_fail("matrix.size() == 1 << nbQubits",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/SWAP.cpp"
                ,0x25,
                "virtual void qclab::qgates::SWAP<float>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = float]"
               );
}

Assistant:

CX( const int control , const int target ,
                 const int controlState = 1 )
        : QControlledGate2< T >( control , controlState )
        , gate_( std::make_unique< PauliX< T > >( target ) )
        {
          assert( control >= 0 ) ; assert( target >= 0 ) ;
          assert( control != target ) ;
        }